

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O2

void OnDiskDataset::merge
               (path *db_base,string *outname,
               vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets,
               TaskSpec *task)

{
  _Rb_tree_header *p_Var1;
  OnDiskDataset *pOVar2;
  pointer pOVar3;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> fname_cache;
  bool bVar4;
  pointer ppOVar5;
  OnDiskIndex *this;
  _Base_ptr p_Var6;
  ostream *poVar7;
  runtime_error *prVar8;
  pointer ppOVar9;
  TaskSpec *args;
  OnDiskIndex *index;
  ulong uVar10;
  pointer pOVar11;
  OnDiskIndex *index_1;
  string_view_t fmt;
  string_view_t fmt_00;
  set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> tmp_types;
  string fname_list;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> indexes;
  set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> index_types;
  pointer local_278;
  undefined8 uStack_270;
  uint7 uStack_267;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  ofstream of;
  undefined4 uStack_22c;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_220 [20];
  
  index_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &index_types._M_t._M_impl.super__Rb_tree_header._M_header;
  index_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  index_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  index_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppOVar5 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar9 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  index_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       index_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((ulong)((long)ppOVar9 - (long)ppOVar5) < 9) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"merge requires at least 2 datasets");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar10 = 1;
  while( true ) {
    pOVar2 = *ppOVar5;
    if ((ulong)((long)ppOVar9 - (long)ppOVar5 >> 3) <= uVar10) {
      pOVar3 = *(pointer *)
                ((long)&(pOVar2->indices).
                        super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl + 8);
      for (pOVar11 = (pOVar2->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>
                     ._M_impl.super__Vector_impl_data._M_start; pOVar11 != pOVar3;
          pOVar11 = pOVar11 + 1) {
        _of = (OnDiskIndex *)CONCAT44(uStack_22c,pOVar11->ntype);
        std::
        _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
        ::_M_insert_unique<IndexType>(&index_types._M_t,(IndexType *)&of);
      }
      uVar10 = 1;
      p_Var1 = &tmp_types._M_t._M_impl.super__Rb_tree_header;
      while( true ) {
        ppOVar5 = (datasets->
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(datasets->
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar5 >> 3) <=
            uVar10) {
          if (task != (TaskSpec *)0x0) {
            LOCK();
            (task->work_estimated_).super___atomic_base<unsigned_long>._M_i =
                 index_types._M_t._M_impl.super__Rb_tree_header._M_node_count << 0x18;
            UNLOCK();
          }
          args = task;
          spdlog::debug<char[39]>((char (*) [39])"Pre-checks succeeded, merge can begin.");
          index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &index_names._M_t._M_impl.super__Rb_tree_header._M_header;
          index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          index_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          p_Var6 = index_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            if ((_Rb_tree_header *)p_Var6 == &index_types._M_t._M_impl.super__Rb_tree_header) break;
            get_index_type_name_abi_cxx11_((string *)&of,p_Var6[1]._M_color);
            fmt.size_ = (size_t)&of;
            fmt.data_ = (char *)0x15;
            spdlog::debug<std::__cxx11::string>
                      ((spdlog *)"Load run offsets: {}.",fmt,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            std::__cxx11::string::~string((string *)&of);
            get_index_type_name_abi_cxx11_((string *)&indexes,p_Var6[1]._M_color);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&of,
                           (string *)&indexes,".");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tmp_types,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&of,
                           outname);
            std::__cxx11::string::~string((string *)&of);
            std::__cxx11::string::~string((string *)&indexes);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&index_names,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tmp_types);
            indexes.super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            indexes.super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            indexes.super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            ppOVar9 = (datasets->
                      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (ppOVar5 = (datasets->
                           super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                           )._M_impl.super__Vector_impl_data._M_start; ppOVar5 != ppOVar9;
                ppOVar5 = ppOVar5 + 1) {
              this = get_index_with_type(*ppOVar5,p_Var6[1]._M_color);
              OnDiskIndex::read_run_offsets
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fname_list,this);
              _of = this;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_220,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fname_list);
              std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::
              emplace_back<IndexMergeHelper>(&indexes,(IndexMergeHelper *)&of);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (local_220);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&fname_list)
              ;
            }
            get_index_type_name_abi_cxx11_((string *)&of,p_Var6[1]._M_color);
            fmt_00.size_ = (size_t)&of;
            fmt_00.data_ = (char *)0x12;
            spdlog::debug<std::__cxx11::string>
                      ((spdlog *)"On disk merge: {}.",fmt_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            std::__cxx11::string::~string((string *)&of);
            args = (TaskSpec *)&indexes;
            OnDiskIndex::on_disk_merge
                      (db_base,(string *)&tmp_types,p_Var6[1]._M_color,&indexes,task);
            std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::~vector(&indexes);
            std::__cxx11::string::~string((string *)&tmp_types);
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          }
          spdlog::debug<char[22]>((char (*) [22])"Merge filename lists.");
          std::operator+(&fname_list,"files.",outname);
          std::ofstream::ofstream(&of);
          std::ios::exceptions
                    ((int)&of +
                     (int)_of[-1].fpath._M_cmpts.
                          super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::experimental::filesystem::v1::__cxx11::path::
          path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                    ((path *)&indexes,&fname_list);
          std::experimental::filesystem::v1::__cxx11::operator/
                    ((path *)&tmp_types,db_base,(path *)&indexes);
          std::ofstream::open((char *)&of,tmp_types._M_t._M_impl._0_4_);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)&tmp_types);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)&indexes);
          ppOVar9 = (datasets->
                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (ppOVar5 = (datasets->
                         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                         )._M_impl.super__Vector_impl_data._M_start; ppOVar5 != ppOVar9;
              ppOVar5 = ppOVar5 + 1) {
            tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:204:13)>
                 ::_M_invoke;
            tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:204:13)>
                 ::_M_manager;
            tmp_types._M_t._M_impl._0_8_ = &of;
            OnDiskFileIndex::for_each_filename
                      ((OnDiskFileIndex *)&(*ppOVar5)->files_index,
                       (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&tmp_types);
            std::_Function_base::~_Function_base((_Function_base *)&tmp_types);
          }
          std::ostream::flush();
          fname_cache.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_str = (char *)uStack_270;
          fname_cache.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_len = (size_t)local_278;
          fname_cache.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _16_8_ = (ulong)uStack_267 << 8;
          store_dataset(db_base,outname,&index_names,&fname_list,fname_cache,
                        &(*(datasets->
                           super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                           )._M_impl.super__Vector_impl_data._M_start)->taints);
          spdlog::debug<char[29]>((char (*) [29])"Merge finished successfully.");
          std::ofstream::~ofstream(&of);
          std::__cxx11::string::~string((string *)&fname_list);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&index_names._M_t);
          std::
          _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
          ::~_Rb_tree(&index_types._M_t);
          return;
        }
        tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tmp_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pOVar2 = ppOVar5[uVar10];
        pOVar3 = *(pointer *)
                  ((long)&(pOVar2->indices).
                          super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl + 8)
        ;
        pOVar11 = (pOVar2->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        tmp_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        for (; pOVar11 != pOVar3; pOVar11 = pOVar11 + 1) {
          _of = (OnDiskIndex *)CONCAT44(uStack_22c,pOVar11->ntype);
          std::
          _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
          ::_M_insert_unique<IndexType>(&tmp_types._M_t,(IndexType *)&of);
        }
        bVar4 = std::operator!=((set<IndexType,_std::less<IndexType>,_std::allocator<IndexType>_> *)
                                &tmp_types._M_t,&index_types);
        if (bVar4) break;
        std::
        _Rb_tree<IndexType,_IndexType,_std::_Identity<IndexType>,_std::less<IndexType>,_std::allocator<IndexType>_>
        ::~_Rb_tree(&tmp_types._M_t);
        uVar10 = uVar10 + 1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&of);
      poVar7 = std::operator<<((ostream *)local_220,"trying to merge \"");
      poVar7 = std::operator<<(poVar7,(string *)
                                      *(datasets->
                                       super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
      poVar7 = std::operator<<(poVar7,"\" and \"");
      poVar7 = std::operator<<(poVar7,(string *)
                                      (datasets->
                                      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar10]);
      std::operator<<(poVar7,"\" ");
      std::operator<<((ostream *)local_220,"but these ones contain index(es) of different type(s)");
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&indexes);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar4 = std::operator==(&(pOVar2->taints)._M_t,&(ppOVar5[uVar10]->taints)._M_t);
    if (!bVar4) break;
    uVar10 = uVar10 + 1;
    ppOVar5 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppOVar9 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&of);
  poVar7 = std::operator<<((ostream *)local_220,"trying to merge \"");
  poVar7 = std::operator<<(poVar7,(string *)
                                  *(datasets->
                                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
  poVar7 = std::operator<<(poVar7,"\" and \"");
  poVar7 = std::operator<<(poVar7,(string *)
                                  (datasets->
                                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar10]);
  std::operator<<(poVar7,"\" ");
  std::operator<<((ostream *)local_220,"but they have different taints - aborting");
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar8,(string *)&tmp_types);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OnDiskDataset::merge(const fs::path &db_base, const std::string &outname,
                          const std::vector<const OnDiskDataset *> &datasets,
                          TaskSpec *task) {
    std::set<IndexType> index_types;

    if (datasets.size() < 2) {
        throw std::runtime_error("merge requires at least 2 datasets");
    }

    for (size_t i = 1; i < datasets.size(); i++) {
        if (!datasets[0]->is_taint_compatible(*datasets[i])) {
            std::stringstream ss;
            ss << "trying to merge \"" << datasets[0]->get_name() << "\" and \""
               << datasets[i]->get_name() << "\" ";
            ss << "but they have different taints - aborting";
            throw std::runtime_error(ss.str());
        }
    }

    for (const OnDiskIndex &index : datasets[0]->indices) {
        index_types.insert(index.index_type());
    }

    for (size_t i = 1; i < datasets.size(); i++) {
        std::set<IndexType> tmp_types;

        for (const OnDiskIndex &index : datasets[i]->indices) {
            tmp_types.insert(index.index_type());
        }

        if (tmp_types != index_types) {
            std::stringstream ss;
            ss << "trying to merge \"" << datasets[0]->get_name() << "\" and \""
               << datasets[i]->get_name() << "\" ";
            ss << "but these ones contain index(es) of different type(s)";
            throw std::runtime_error(ss.str());
        }
    }

    if (task != nullptr) {
        task->estimate_work(NUM_TRIGRAMS * index_types.size());
    }

    spdlog::debug("Pre-checks succeeded, merge can begin.");

    std::set<std::string> index_names;
    for (const auto &ndxtype : index_types) {
        spdlog::debug("Load run offsets: {}.", get_index_type_name(ndxtype));
        std::string index_name = get_index_type_name(ndxtype) + "." + outname;
        index_names.insert(index_name);
        std::vector<IndexMergeHelper> indexes;
        for (const OnDiskDataset *dataset : datasets) {
            const OnDiskIndex &index = dataset->get_index_with_type(ndxtype);
            indexes.emplace_back(
                IndexMergeHelper(&index, dataset->files_index->get_file_count(),
                                 index.read_run_offsets()));
        }
        spdlog::debug("On disk merge: {}.", get_index_type_name(ndxtype));
        OnDiskIndex::on_disk_merge(db_base, index_name, ndxtype, indexes, task);
    }

    spdlog::debug("Merge filename lists.");

    std::string fname_list = "files." + outname;
    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / fname_list, std::ofstream::binary);

    for (const OnDiskDataset *ds : datasets) {
        ds->files_index->for_each_filename(
            [&of](const std::string &fname) { of << fname << "\n"; });
    }
    of.flush();

    store_dataset(db_base, outname, index_names, fname_list, std::nullopt,
                  datasets[0]->get_taints());

    spdlog::debug("Merge finished successfully.");
}